

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O2

long __thiscall glcts::BasicUsageSimple::Run(BasicUsageSimple *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  GLenum GVar3;
  undefined4 *puVar4;
  long lVar5;
  allocator<char> local_49;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "\nlayout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\nlayout(std430) buffer Output {\n  mediump vec4 color;\n} g_out;\nlayout(binding = 0, offset = 0) uniform atomic_uint ac_counter;\nvoid main() {\n  mediump uint c = atomicCounterIncrement(ac_counter);\n  mediump float r = float(c / 40u) / 255.0;\n  g_out.color = vec4(r, 0.0, 0.0, 1.0);\n}"
             ,&local_49);
  GVar2 = BasicUsageCS::CreateComputeProgram(&this->super_BasicUsageCS,&local_48);
  this->prog_ = GVar2;
  std::__cxx11::string::~string((string *)&local_48);
  this_00 = &(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->prog_);
  bVar1 = BasicUsageCS::CheckProgram(&this->super_BasicUsageCS,this->prog_,(bool *)0x0);
  if (bVar1) {
    glu::CallLogWrapper::glGenBuffers(this_00,1,(GLuint *)&(this->super_BasicUsageCS).field_0x34);
    glu::CallLogWrapper::glBindBuffer
              (this_00,0x92c0,*(GLuint *)&(this->super_BasicUsageCS).field_0x34);
    glu::CallLogWrapper::glBufferData(this_00,0x92c0,4,(void *)0x0,0x88ea);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
    glu::CallLogWrapper::glBindBuffer
              (this_00,0x92c0,*(GLuint *)&(this->super_BasicUsageCS).field_0x34);
    puVar4 = (undefined4 *)glu::CallLogWrapper::glMapBufferRange(this_00,0x92c0,0,4,10);
    *puVar4 = 0;
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x92c0);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->storage_buffer_);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->storage_buffer_);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
    glu::CallLogWrapper::glUseProgram(this_00,this->prog_);
    glu::CallLogWrapper::glBindBufferBase
              (this_00,0x92c0,0,*(GLuint *)&(this->super_BasicUsageCS).field_0x34);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->storage_buffer_);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    GVar3 = glu::CallLogWrapper::glGetError(this_00);
    lVar5 = -(ulong)(GVar3 != 0);
  }
  else {
    lVar5 = -1;
  }
  return lVar5;
}

Assistant:

virtual long Run()
	{
		const char* glsl_cs =
			NL "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;" NL "layout(std430) buffer Output {" NL
			   "  mediump vec4 color;" NL "} g_out;" NL
			   "layout(binding = 0, offset = 0) uniform atomic_uint ac_counter;" NL "void main() {" NL
			   "  mediump uint c = atomicCounterIncrement(ac_counter);" NL
			   "  mediump float r = float(c / 40u) / 255.0;" NL "  g_out.color = vec4(r, 0.0, 0.0, 1.0);" NL "}";
		prog_ = CreateComputeProgram(glsl_cs);
		glLinkProgram(prog_);
		if (!CheckProgram(prog_))
			return ERROR;

		// create atomic counter buffer
		glGenBuffers(1, &counter_buffer_);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 4, NULL, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		// clear counter buffer (set to 0)
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_);
		unsigned int* ptr = static_cast<unsigned int*>(
			glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, 4, GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT));
		*ptr = 0;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);

		// create shader storage buffer
		glGenBuffers(1, &storage_buffer_);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, storage_buffer_);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 16, NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(prog_);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, counter_buffer_);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, storage_buffer_);
		glDispatchCompute(1, 1, 1);

		if (glGetError() != GL_NO_ERROR)
		{
			return ERROR;
		}
		else
		{
			return NO_ERROR;
		}
	}